

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

float Imath_3_2::anon_unknown_20::maxOffDiag<float>(Matrix33<float> *A)

{
  float *pfVar1;
  Matrix33<float> *in_RDI;
  Matrix33<float> *pMVar2;
  float result;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  Matrix33<float> *local_8;
  
  local_c = 0.0;
  local_8 = in_RDI;
  Matrix33<float>::operator[](in_RDI,0);
  std::abs((int)in_RDI);
  pfVar1 = std::max<float>(&local_c,&local_10);
  local_c = *pfVar1;
  pMVar2 = local_8;
  Matrix33<float>::operator[](local_8,0);
  std::abs((int)pMVar2);
  pfVar1 = std::max<float>(&local_c,&local_14);
  local_c = *pfVar1;
  pMVar2 = local_8;
  Matrix33<float>::operator[](local_8,1);
  std::abs((int)pMVar2);
  pfVar1 = std::max<float>(&local_c,&local_18);
  local_c = *pfVar1;
  pMVar2 = local_8;
  Matrix33<float>::operator[](local_8,1);
  std::abs((int)pMVar2);
  pfVar1 = std::max<float>(&local_c,&local_1c);
  local_c = *pfVar1;
  pMVar2 = local_8;
  Matrix33<float>::operator[](local_8,2);
  std::abs((int)pMVar2);
  pfVar1 = std::max<float>(&local_c,&local_20);
  local_c = *pfVar1;
  Matrix33<float>::operator[](local_8,2);
  std::abs((int)local_8);
  pfVar1 = std::max<float>(&local_c,&local_24);
  return *pfVar1;
}

Assistant:

IMATH_CONSTEXPR14 T
maxOffDiag (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    T result = 0;
    result   = std::max (result, std::abs (A[0][1]));
    result   = std::max (result, std::abs (A[0][2]));
    result   = std::max (result, std::abs (A[1][0]));
    result   = std::max (result, std::abs (A[1][2]));
    result   = std::max (result, std::abs (A[2][0]));
    result   = std::max (result, std::abs (A[2][1]));
    return result;
}